

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O0

void helper_macsatu_m68k(CPUM68KState_conflict *env,uint32_t acc)

{
  ulong local_20;
  uint64_t val;
  uint32_t acc_local;
  CPUM68KState_conflict *env_local;
  
  local_20 = env->macc[acc];
  if ((local_20 & 0xffff000000000000) != 0) {
    env->macsr = env->macsr | 2;
  }
  if ((env->macsr & 2) != 0) {
    env->macsr = 0x100 << ((byte)acc & 0x1f) | env->macsr;
    if ((env->macsr & 0x80) == 0) {
      local_20 = local_20 & 0xffffffffffff;
    }
    else if (local_20 < 0x20000000000001) {
      local_20 = 0xffffffffffff;
    }
    else {
      local_20 = 0;
    }
  }
  env->macc[acc] = local_20;
  return;
}

Assistant:

void HELPER(macsatu)(CPUM68KState *env, uint32_t acc)
{
    uint64_t val;

    val = env->macc[acc];
    if (val & (0xffffull << 48)) {
        env->macsr |= MACSR_V;
    }
    if (env->macsr & MACSR_V) {
        env->macsr |= MACSR_PAV0 << acc;
        if (env->macsr & MACSR_OMC) {
            if (val > (1ull << 53))
                val = 0;
            else
                val = (1ull << 48) - 1;
        } else {
            val &= ((1ull << 48) - 1);
        }
    }
    env->macc[acc] = val;
}